

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_Logistic_Test::Sampling_Logistic_Test(Sampling_Logistic_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Sampling_Logistic_Test_037459e0;
  return;
}

Assistant:

TEST(Sampling, Logistic) {
    Float params[][3] = {{1., -Pi, Pi}, {5, 0, 3}, {.25, -5, -3}};
    for (const auto p : params) {
        Float s = p[0], a = p[1], b = p[2];
        auto logistic = [&](Float v) { return TrimmedLogistic(v, s, a, b); };

        auto values = Sample1DFunction(logistic, 8192, 16, a, b);
        PiecewiseConstant1D distrib(values, a, b);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedLogistic(u, s, a, b);
            Float cp = TrimmedLogisticPDF(cx, s, a, b);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 3e-3)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedLogisticSample(cx, s, a, b);
        }
    }
}